

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O0

void Ivy_GraphUpdateNetwork3
               (Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int fUpdateLevel,int nGain)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  int local_44;
  int nRefsOld;
  int i;
  int nNodesOld;
  int nNodesNew;
  Ivy_Obj_t *pFanin;
  Ivy_Obj_t *pRootNew;
  int nGain_local;
  int fUpdateLevel_local;
  Dec_Graph_t *pGraph_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ManNodeNum(p);
  for (local_44 = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)((long)p->pData + 0x90)), local_44 < iVar2;
      local_44 = local_44 + 1) {
    pIVar3 = (Ivy_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)p->pData + 0x90),local_44);
    pIVar3 = Ivy_Regular(pIVar3);
    Ivy_ObjRefsInc(pIVar3);
  }
  iVar2 = pRoot->nRefs;
  pRoot->nRefs = 0;
  Ivy_ObjDelete_rec(p,pRoot,0);
  pRoot->nRefs = iVar2;
  for (local_44 = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)((long)p->pData + 0x90)), local_44 < iVar2;
      local_44 = local_44 + 1) {
    pIVar3 = (Ivy_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)p->pData + 0x90),local_44);
    pIVar3 = Ivy_Regular(pIVar3);
    Ivy_ObjRefsDec(pIVar3);
  }
  pIVar3 = Ivy_GraphToNetwork(p,pGraph);
  Ivy_ObjReplace(p,pRoot,pIVar3,0,0,1);
  for (local_44 = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)((long)p->pData + 0x90)), local_44 < iVar2;
      local_44 = local_44 + 1) {
    pIVar3 = (Ivy_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)p->pData + 0x90),local_44);
    pIVar3 = Ivy_Regular(pIVar3);
    iVar2 = Ivy_ObjIsNone(pIVar3);
    if ((iVar2 == 0) && (iVar2 = Ivy_ObjRefs(pIVar3), iVar2 == 0)) {
      Ivy_ObjDelete_rec(p,pIVar3,1);
    }
  }
  iVar2 = Ivy_ManNodeNum(p);
  if (iVar1 - iVar2 < nGain) {
    __assert_fail("nGain <= nNodesOld - nNodesNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                  ,0x260,
                  "void Ivy_GraphUpdateNetwork3(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int, int)")
    ;
  }
  return;
}

Assistant:

void Ivy_GraphUpdateNetwork3( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain )
{
    Ivy_Obj_t * pRootNew, * pFanin;
    int nNodesNew, nNodesOld, i, nRefsOld;
    nNodesOld = Ivy_ManNodeNum(p);

//printf( "Before = %d. ", Ivy_ManNodeNum(p) );
    // mark the cut
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
        Ivy_ObjRefsInc( Ivy_Regular(pFanin) );
    // deref the old cone
    nRefsOld = pRoot->nRefs;  
    pRoot->nRefs = 0;
    Ivy_ObjDelete_rec( p, pRoot, 0 );
    pRoot->nRefs = nRefsOld;
    // unmark the cut
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
        Ivy_ObjRefsDec( Ivy_Regular(pFanin) );
//printf( "Deref = %d. ", Ivy_ManNodeNum(p) );
 
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetwork( p, pGraph );
//printf( "Create = %d. ", Ivy_ManNodeNum(p) );
    // remove the old nodes
//    Ivy_AigReplace( pMan->pManFunc, pRoot, pRootNew, fUpdateLevel );
/*
    if ( Ivy_IsComplement(pRootNew) )
        printf( "c" );
    else
        printf( "d" );
    if ( Ivy_ObjRefs(Ivy_Regular(pRootNew)) > 0 )
        printf( "%d", Ivy_ObjRefs(Ivy_Regular(pRootNew)) );
    printf( " " );
*/
    Ivy_ObjReplace( p, pRoot, pRootNew, 0, 0, 1 );
//printf( "Replace = %d. ", Ivy_ManNodeNum(p) );

    // delete remaining dangling nodes
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
    {
        pFanin = Ivy_Regular(pFanin);
        if ( !Ivy_ObjIsNone(pFanin) && Ivy_ObjRefs(pFanin) == 0 )
            Ivy_ObjDelete_rec( p, pFanin, 1 );
    }
//printf( "Deref = %d. ", Ivy_ManNodeNum(p) );
//printf( "\n" );

    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
}